

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handles.cpp
# Opt level: O0

void __thiscall uv11::Handle::~Handle(Handle *this)

{
  Handle *this_local;
  
  this->_vptr_Handle = (_func_int **)&PTR__Handle_00113a10;
  std::function<void_(uv11::Handle_&)>::~function(&this->on_close);
  std::function<void_(uv11::Handle_&,_unsigned_long,_uv_buf_t_*)>::~function(&this->on_alloc);
  return;
}

Assistant:

Handle::~Handle() {}